

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

iterator __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::begin(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
        *this)

{
  optional<std::pair<int,_int>_> *poVar1;
  iterator iVar2;
  
  poVar1 = (this->table).ptr;
  iVar2.end = poVar1 + (this->table).nStored;
  for (; (poVar1 < iVar2.end && (poVar1->set == false)); poVar1 = poVar1 + 1) {
  }
  iVar2.ptr = poVar1;
  return iVar2;
}

Assistant:

PBRT_CPU_GPU
    iterator begin() {
        Iterator iter(table.data(), table.data() + table.size());
        while (iter.ptr < iter.end && !iter.ptr->has_value())
            ++iter.ptr;
        return iter;
    }